

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined8 uVar23;
  Scene *pSVar24;
  Ref<embree::Geometry> *pRVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  Geometry *pGVar33;
  Geometry *pGVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 uVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  StackItemT<embree::NodeRefPtr<4>_> *pSVar53;
  int iVar54;
  undefined4 uVar55;
  AABBNodeMB4D *node1;
  ulong uVar56;
  long lVar57;
  long lVar58;
  Device *pDVar59;
  uint uVar60;
  Geometry *pGVar61;
  ulong uVar62;
  ulong uVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  ulong uVar72;
  StackItemT<embree::NodeRefPtr<4>_> *pSVar73;
  long lVar74;
  long lVar75;
  ulong uVar76;
  ulong uVar77;
  ulong uVar78;
  ulong uVar79;
  ulong uVar80;
  float fVar81;
  float fVar112;
  float fVar114;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar101;
  float fVar113;
  float fVar115;
  float fVar117;
  undefined1 auVar102 [16];
  float fVar116;
  float fVar118;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar111;
  float fVar119;
  uint uVar135;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  uint uVar120;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar124;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar146;
  float fVar148;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  undefined1 auVar144 [16];
  float fVar147;
  float fVar150;
  float fVar153;
  undefined1 auVar145 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar156;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar162;
  float fVar171;
  float fVar172;
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  float fVar173;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  StackItemT<embree::NodeRefPtr<4>_> SVar177;
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar180;
  float fVar181;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar189;
  float fVar190;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float fVar219;
  undefined1 auVar212 [16];
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar225;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar232;
  float fVar233;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  undefined1 auVar230 [16];
  float fVar234;
  undefined1 auVar231 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar242 [16];
  float fVar243;
  float fStack_1430;
  float fStack_142c;
  undefined4 local_1428;
  undefined4 uStack_1424;
  float fStack_1420;
  float fStack_141c;
  float local_1408;
  float fStack_1404;
  float fStack_1400;
  float fStack_13fc;
  vbool<4> valid;
  float local_13c8;
  float fStack_13c4;
  float fStack_13c0;
  float fStack_13bc;
  float fStack_13a4;
  float fStack_1394;
  undefined1 local_1388 [16];
  undefined1 local_1378 [8];
  float fStack_1370;
  float fStack_136c;
  float local_1368;
  float fStack_1364;
  float fStack_1360;
  float fStack_135c;
  float local_1358;
  float fStack_1354;
  float fStack_1350;
  float fStack_134c;
  float local_1348;
  float fStack_1344;
  float fStack_1340;
  float fStack_133c;
  RTCFilterFunctionNArguments args;
  float fStack_12d0;
  float fStack_12cc;
  undefined1 local_12c8 [12];
  float fStack_12bc;
  float fStack_12b0;
  float fStack_12ac;
  undefined8 local_12a8;
  Scene *scene;
  float local_1298;
  float fStack_1294;
  float fStack_1290;
  float fStack_128c;
  float local_1288;
  float fStack_1284;
  float fStack_1280;
  float fStack_127c;
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  float fStack_126c;
  vfloat<4> tNear;
  undefined1 local_11f8 [16];
  undefined1 local_11e8 [16];
  undefined1 local_11d8 [8];
  float fStack_11d0;
  float fStack_11cc;
  undefined1 local_11c8 [16];
  undefined1 local_11b8 [16];
  undefined1 local_11a8 [16];
  undefined1 local_1198 [16];
  float local_1188;
  float fStack_1184;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float fStack_1174;
  float fStack_1170;
  float fStack_116c;
  long local_1168;
  long local_1160;
  undefined1 local_1158 [16];
  float local_1148;
  float fStack_1144;
  float fStack_1140;
  float fStack_113c;
  undefined1 local_1138 [16];
  undefined1 local_1128 [16];
  undefined1 local_1118 [16];
  undefined4 local_1108;
  undefined4 uStack_1104;
  undefined4 uStack_1100;
  undefined4 uStack_10fc;
  undefined4 local_10f8;
  undefined4 uStack_10f4;
  undefined4 uStack_10f0;
  undefined4 uStack_10ec;
  undefined1 local_10e8 [16];
  undefined1 local_10d8 [16];
  uint local_10c8;
  uint uStack_10c4;
  uint uStack_10c0;
  uint uStack_10bc;
  uint local_10b8;
  uint uStack_10b4;
  uint uStack_10b0;
  uint uStack_10ac;
  undefined8 local_10a8;
  undefined8 uStack_10a0;
  undefined8 local_1098;
  undefined8 uStack_1090;
  float local_1088;
  float fStack_1084;
  float fStack_1080;
  float fStack_107c;
  float local_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  float local_fa8;
  float fStack_fa4;
  float fStack_fa0;
  float fStack_f9c;
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float local_f88;
  float fStack_f84;
  float fStack_f80;
  float fStack_f7c;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  
  pSVar73 = stack + 1;
  stack[0].ptr.ptr = root.ptr;
  stack[0].dist = 0;
  fVar119 = *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar209 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar221 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  fVar208 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar220 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar226 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar243 = fVar208 * 0.99999964;
  fVar180 = fVar220 * 0.99999964;
  fVar239 = fVar226 * 0.99999964;
  fVar208 = fVar208 * 1.0000004;
  fVar220 = fVar220 * 1.0000004;
  fVar226 = fVar226 * 1.0000004;
  uVar69 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar80 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar79 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar54 = (tray->tnear).field_0.i[k];
  auVar142._4_4_ = iVar54;
  auVar142._0_4_ = iVar54;
  auVar142._8_4_ = iVar54;
  auVar142._12_4_ = iVar54;
  iVar54 = (tray->tfar).field_0.i[k];
  auVar185._4_4_ = iVar54;
  auVar185._0_4_ = iVar54;
  auVar185._8_4_ = iVar54;
  auVar185._12_4_ = iVar54;
  local_1098 = mm_lookupmask_ps._0_8_;
  uStack_1090 = mm_lookupmask_ps._8_8_;
  local_10a8 = mm_lookupmask_ps._240_8_;
  uStack_10a0 = mm_lookupmask_ps._248_8_;
  pGVar61 = (Geometry *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_1018 = fVar119;
  fStack_1014 = fVar119;
  fStack_1010 = fVar119;
  fStack_100c = fVar119;
  local_1028 = fVar209;
  fStack_1024 = fVar209;
  fStack_1020 = fVar209;
  fStack_101c = fVar209;
  local_1038 = fVar221;
  fStack_1034 = fVar221;
  fStack_1030 = fVar221;
  fStack_102c = fVar221;
  local_1048 = fVar208;
  fStack_1044 = fVar208;
  fStack_1040 = fVar208;
  fStack_103c = fVar208;
  local_1058 = fVar220;
  fStack_1054 = fVar220;
  fStack_1050 = fVar220;
  fStack_104c = fVar220;
  local_1068 = fVar226;
  fStack_1064 = fVar226;
  fStack_1060 = fVar226;
  fStack_105c = fVar226;
  local_1078 = fVar239;
  fStack_1074 = fVar239;
  fStack_1070 = fVar239;
  fStack_106c = fVar239;
  local_1088 = fVar243;
  fStack_1084 = fVar243;
  fStack_1080 = fVar243;
  fStack_107c = fVar243;
  local_1148 = fVar180;
  fStack_1144 = fVar180;
  fStack_1140 = fVar180;
  fStack_113c = fVar180;
  local_1158 = auVar142;
  fVar113 = fVar119;
  fVar115 = fVar119;
  fVar116 = fVar119;
  fVar117 = fVar209;
  fVar118 = fVar209;
  fVar138 = fVar209;
  fVar147 = fVar221;
  fVar150 = fVar221;
  fVar153 = fVar221;
  fVar181 = fVar243;
  fVar222 = fVar243;
  fVar217 = fVar243;
  fVar215 = fVar180;
  fVar225 = fVar180;
  fVar219 = fVar180;
  fVar229 = fVar208;
  fVar234 = fVar208;
  fVar241 = fVar208;
  fVar81 = fVar220;
  fVar112 = fVar220;
  fVar114 = fVar220;
  fVar190 = fVar226;
  fVar194 = fVar226;
  fVar196 = fVar226;
  fVar136 = fVar239;
  fVar137 = fVar239;
  fVar146 = fVar239;
LAB_0071d554:
  do {
    do {
      if (pSVar73 == stack) {
        return;
      }
      pSVar53 = pSVar73 + -1;
      pSVar73 = pSVar73 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) <= (float)pSVar53->dist &&
             (float)pSVar53->dist != *(float *)(ray + k * 4 + 0x80));
    uVar67 = (pSVar73->ptr).ptr;
    while ((uVar67 & 8) == 0) {
      uVar56 = uVar67 & 0xfffffffffffffff0;
      fVar148 = *(float *)(ray + k * 4 + 0x70);
      pfVar20 = (float *)(uVar56 + 0x80 + uVar69);
      pfVar19 = (float *)(uVar56 + 0x20 + uVar69);
      auVar139._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar119) * fVar243;
      auVar139._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar113) * fVar181;
      auVar139._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar115) * fVar222;
      auVar139._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar116) * fVar217;
      auVar139 = maxps(auVar142,auVar139);
      pfVar20 = (float *)(uVar56 + 0x80 + uVar80);
      pfVar19 = (float *)(uVar56 + 0x20 + uVar80);
      auVar154._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar209) * fVar180;
      auVar154._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar117) * fVar215;
      auVar154._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar118) * fVar225;
      auVar154._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar138) * fVar219;
      pfVar20 = (float *)(uVar56 + 0x80 + uVar79);
      pfVar19 = (float *)(uVar56 + 0x20 + uVar79);
      auVar176._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar221) * fVar239;
      auVar176._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar147) * fVar136;
      auVar176._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar150) * fVar137;
      auVar176._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar153) * fVar146;
      auVar154 = maxps(auVar154,auVar176);
      tNear.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)maxps(auVar139,auVar154);
      pfVar20 = (float *)(uVar56 + 0x80 + (uVar69 ^ 0x10));
      pfVar19 = (float *)(uVar56 + 0x20 + (uVar69 ^ 0x10));
      auVar183._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar119) * fVar208;
      auVar183._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar113) * fVar229;
      auVar183._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar115) * fVar234;
      auVar183._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar116) * fVar241;
      auVar139 = minps(auVar185,auVar183);
      pfVar20 = (float *)(uVar56 + 0x80 + (uVar80 ^ 0x10));
      pfVar19 = (float *)(uVar56 + 0x20 + (uVar80 ^ 0x10));
      auVar163._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar209) * fVar220;
      auVar163._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar117) * fVar81;
      auVar163._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar118) * fVar112;
      auVar163._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar138) * fVar114;
      pfVar20 = (float *)(uVar56 + 0x80 + (uVar79 ^ 0x10));
      pfVar19 = (float *)(uVar56 + 0x20 + (uVar79 ^ 0x10));
      auVar174._0_4_ = ((*pfVar20 * fVar148 + *pfVar19) - fVar221) * fVar226;
      auVar174._4_4_ = ((pfVar20[1] * fVar148 + pfVar19[1]) - fVar147) * fVar190;
      auVar174._8_4_ = ((pfVar20[2] * fVar148 + pfVar19[2]) - fVar150) * fVar194;
      auVar174._12_4_ = ((pfVar20[3] * fVar148 + pfVar19[3]) - fVar153) * fVar196;
      auVar154 = minps(auVar163,auVar174);
      auVar139 = minps(auVar139,auVar154);
      if (((uint)uVar67 & 7) == 6) {
        bVar35 = (fVar148 < *(float *)(uVar56 + 0xf0) && *(float *)(uVar56 + 0xe0) <= fVar148) &&
                 tNear.field_0._0_4_ <= auVar139._0_4_;
        bVar36 = (fVar148 < *(float *)(uVar56 + 0xf4) && *(float *)(uVar56 + 0xe4) <= fVar148) &&
                 tNear.field_0._4_4_ <= auVar139._4_4_;
        bVar37 = (fVar148 < *(float *)(uVar56 + 0xf8) && *(float *)(uVar56 + 0xe8) <= fVar148) &&
                 tNear.field_0._8_4_ <= auVar139._8_4_;
        bVar38 = (fVar148 < *(float *)(uVar56 + 0xfc) && *(float *)(uVar56 + 0xec) <= fVar148) &&
                 tNear.field_0._12_4_ <= auVar139._12_4_;
      }
      else {
        bVar35 = tNear.field_0._0_4_ <= auVar139._0_4_;
        bVar36 = tNear.field_0._4_4_ <= auVar139._4_4_;
        bVar37 = tNear.field_0._8_4_ <= auVar139._8_4_;
        bVar38 = tNear.field_0._12_4_ <= auVar139._12_4_;
      }
      auVar82._0_4_ = (uint)bVar35 * -0x80000000;
      auVar82._4_4_ = (uint)bVar36 * -0x80000000;
      auVar82._8_4_ = (uint)bVar37 * -0x80000000;
      auVar82._12_4_ = (uint)bVar38 * -0x80000000;
      uVar60 = movmskps((int)pGVar61,auVar82);
      pGVar61 = (Geometry *)(ulong)uVar60;
      if (uVar60 == 0) goto LAB_0071d554;
      pGVar61 = (Geometry *)0x0;
      if ((byte)uVar60 != 0) {
        for (; ((byte)uVar60 >> (long)pGVar61 & 1) == 0;
            pGVar61 = (Geometry *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + 1)) {
        }
      }
      uVar67 = *(ulong *)(uVar56 + (long)pGVar61 * 8);
      uVar60 = (uVar60 & 0xff) - 1 & uVar60 & 0xff;
      if (uVar60 != 0) {
        uVar120 = tNear.field_0.i[(long)pGVar61];
        lVar74 = 0;
        if (uVar60 != 0) {
          for (; (uVar60 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
          }
        }
        uVar62 = *(ulong *)(uVar56 + lVar74 * 8);
        uVar135 = tNear.field_0.i[lVar74];
        uVar60 = uVar60 - 1 & uVar60;
        pGVar61 = (Geometry *)(ulong)uVar60;
        if (uVar60 == 0) {
          if (uVar120 < uVar135) {
            (pSVar73->ptr).ptr = uVar62;
            pSVar73->dist = uVar135;
            pSVar73 = pSVar73 + 1;
          }
          else {
            (pSVar73->ptr).ptr = uVar67;
            pSVar73->dist = uVar120;
            uVar67 = uVar62;
            pSVar73 = pSVar73 + 1;
          }
        }
        else {
          auVar140._8_4_ = uVar120;
          auVar140._0_8_ = uVar67;
          auVar140._12_4_ = 0;
          auVar164._8_4_ = uVar135;
          auVar164._0_8_ = uVar62;
          auVar164._12_4_ = 0;
          lVar74 = 0;
          if (pGVar61 != (Geometry *)0x0) {
            for (; (uVar60 >> lVar74 & 1) == 0; lVar74 = lVar74 + 1) {
            }
          }
          uVar23 = *(undefined8 *)(uVar56 + lVar74 * 8);
          iVar54 = tNear.field_0.i[lVar74];
          auVar155._8_4_ = iVar54;
          auVar155._0_8_ = uVar23;
          auVar155._12_4_ = 0;
          auVar83._8_4_ = -(uint)((int)uVar120 < (int)uVar135);
          uVar60 = uVar60 - 1 & uVar60;
          if (uVar60 == 0) {
            auVar83._4_4_ = auVar83._8_4_;
            auVar83._0_4_ = auVar83._8_4_;
            auVar83._12_4_ = auVar83._8_4_;
            auVar175._8_4_ = uVar135;
            auVar175._0_8_ = uVar62;
            auVar175._12_4_ = 0;
            auVar176 = blendvps(auVar175,auVar140,auVar83);
            auVar139 = blendvps(auVar140,auVar164,auVar83);
            auVar84._8_4_ = -(uint)(auVar176._8_4_ < iVar54);
            auVar84._4_4_ = auVar84._8_4_;
            auVar84._0_4_ = auVar84._8_4_;
            auVar84._12_4_ = auVar84._8_4_;
            auVar165._8_4_ = iVar54;
            auVar165._0_8_ = uVar23;
            auVar165._12_4_ = 0;
            auVar154 = blendvps(auVar165,auVar176,auVar84);
            auVar176 = blendvps(auVar176,auVar155,auVar84);
            auVar85._8_4_ = -(uint)(auVar139._8_4_ < auVar176._8_4_);
            auVar85._4_4_ = auVar85._8_4_;
            auVar85._0_4_ = auVar85._8_4_;
            auVar85._12_4_ = auVar85._8_4_;
            SVar156 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar176,auVar139,auVar85);
            SVar141 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar139,auVar176,auVar85);
            *pSVar73 = SVar141;
            pSVar73[1] = SVar156;
            uVar67 = auVar154._0_8_;
            pSVar73 = pSVar73 + 2;
          }
          else {
            pGVar61 = (Geometry *)0x0;
            if (uVar60 != 0) {
              for (; (uVar60 >> (long)pGVar61 & 1) == 0;
                  pGVar61 = (Geometry *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + 1)) {
              }
            }
            auVar86._4_4_ = auVar83._8_4_;
            auVar86._0_4_ = auVar83._8_4_;
            auVar86._8_4_ = auVar83._8_4_;
            auVar86._12_4_ = auVar83._8_4_;
            auVar176 = blendvps(auVar164,auVar140,auVar86);
            auVar142 = blendvps(auVar140,auVar164,auVar86);
            auVar182._8_4_ = tNear.field_0.i[(long)pGVar61];
            auVar182._0_8_ = *(undefined8 *)(uVar56 + (long)pGVar61 * 8);
            auVar182._12_4_ = 0;
            auVar87._8_4_ = -(uint)(iVar54 < tNear.field_0.i[(long)pGVar61]);
            auVar87._4_4_ = auVar87._8_4_;
            auVar87._0_4_ = auVar87._8_4_;
            auVar87._12_4_ = auVar87._8_4_;
            auVar154 = blendvps(auVar182,auVar155,auVar87);
            auVar139 = blendvps(auVar155,auVar182,auVar87);
            auVar88._8_4_ = -(uint)(auVar142._8_4_ < auVar139._8_4_);
            auVar88._4_4_ = auVar88._8_4_;
            auVar88._0_4_ = auVar88._8_4_;
            auVar88._12_4_ = auVar88._8_4_;
            auVar183 = blendvps(auVar139,auVar142,auVar88);
            SVar141 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar142,auVar139,auVar88);
            auVar89._8_4_ = -(uint)(auVar176._8_4_ < auVar154._8_4_);
            auVar89._4_4_ = auVar89._8_4_;
            auVar89._0_4_ = auVar89._8_4_;
            auVar89._12_4_ = auVar89._8_4_;
            auVar142 = blendvps(auVar154,auVar176,auVar89);
            auVar139 = blendvps(auVar176,auVar154,auVar89);
            auVar90._8_4_ = -(uint)(auVar139._8_4_ < auVar183._8_4_);
            auVar90._4_4_ = auVar90._8_4_;
            auVar90._0_4_ = auVar90._8_4_;
            auVar90._12_4_ = auVar90._8_4_;
            SVar156 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar183,auVar139,auVar90);
            SVar177 = (StackItemT<embree::NodeRefPtr<4>_>)blendvps(auVar139,auVar183,auVar90);
            *pSVar73 = SVar141;
            pSVar73[1] = SVar177;
            pSVar73[2] = SVar156;
            uVar67 = auVar142._0_8_;
            pSVar73 = pSVar73 + 3;
            auVar142 = local_1158;
            fVar180 = local_1148;
            fVar215 = fStack_1144;
            fVar225 = fStack_1140;
            fVar219 = fStack_113c;
          }
        }
      }
    }
    local_1168 = (ulong)((uint)uVar67 & 0xf) - 8;
    uVar67 = uVar67 & 0xfffffffffffffff0;
    for (local_1160 = 0; local_1160 != local_1168; local_1160 = local_1160 + 1) {
      lVar74 = local_1160 * 0x60;
      pSVar24 = context->scene;
      pRVar25 = (pSVar24->geometries).items;
      pGVar61 = pRVar25[*(uint *)(uVar67 + 0x40 + lVar74)].ptr;
      fVar119 = (pGVar61->time_range).lower;
      fVar209 = ((*(float *)(ray + k * 4 + 0x70) - fVar119) /
                ((pGVar61->time_range).upper - fVar119)) * pGVar61->fnumTimeSegments;
      auVar143 = roundss(ZEXT416((uint)fVar119),ZEXT416((uint)fVar209),9);
      fVar119 = pGVar61->fnumTimeSegments + -1.0;
      if (fVar119 <= auVar143._0_4_) {
        auVar143._0_4_ = fVar119;
      }
      fVar119 = 0.0;
      if (0.0 <= auVar143._0_4_) {
        fVar119 = auVar143._0_4_;
      }
      lVar75 = (long)(int)fVar119 * 0x38;
      lVar26 = *(long *)(*(long *)&pGVar61[2].numPrimitives + lVar75);
      uVar60 = *(uint *)(uVar67 + 4 + lVar74);
      lVar58 = lVar26 + (ulong)*(uint *)(uVar67 + lVar74) * 4;
      uVar120 = *(uint *)(uVar67 + 0x10 + lVar74);
      lVar1 = lVar26 + (ulong)uVar120 * 4;
      uVar56 = (ulong)*(uint *)(uVar67 + 0x20 + lVar74);
      pfVar19 = (float *)(lVar26 + uVar56 * 4);
      fVar113 = *pfVar19;
      fVar115 = pfVar19[1];
      fVar116 = pfVar19[2];
      uVar62 = (ulong)*(uint *)(uVar67 + 0x30 + lVar74);
      puVar2 = (undefined8 *)(lVar26 + uVar62 * 4);
      uVar23 = *puVar2;
      uVar50 = puVar2[1];
      lVar27 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x44 + lVar74)].ptr[2].numPrimitives;
      lVar28 = *(long *)(lVar27 + lVar75);
      lVar26 = lVar28 + (ulong)uVar60 * 4;
      uVar63 = (ulong)*(uint *)(uVar67 + 0x14 + lVar74);
      lVar3 = lVar28 + uVar63 * 4;
      uVar64 = (ulong)*(uint *)(uVar67 + 0x24 + lVar74);
      pfVar19 = (float *)(lVar28 + uVar64 * 4);
      fVar117 = *pfVar19;
      fVar118 = pfVar19[1];
      fVar138 = pfVar19[2];
      uVar65 = (ulong)*(uint *)(uVar67 + 0x34 + lVar74);
      pfVar19 = (float *)(lVar28 + uVar65 * 4);
      lVar29 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x48 + lVar74)].ptr[2].numPrimitives;
      lVar30 = *(long *)(lVar29 + lVar75);
      uVar66 = (ulong)*(uint *)(uVar67 + 8 + lVar74);
      lVar28 = lVar30 + uVar66 * 4;
      uVar70 = (ulong)*(uint *)(uVar67 + 0x18 + lVar74);
      uVar71 = (ulong)*(uint *)(uVar67 + 0x28 + lVar74);
      pfVar20 = (float *)(lVar30 + uVar71 * 4);
      fVar147 = pfVar20[1];
      uVar72 = (ulong)*(uint *)(uVar67 + 0x38 + lVar74);
      pfVar4 = (float *)(lVar30 + uVar72 * 4);
      fVar209 = fVar209 - fVar119;
      lVar31 = *(long *)&pRVar25[*(uint *)(uVar67 + 0x4c + lVar74)].ptr[2].numPrimitives;
      lVar32 = *(long *)(lVar31 + lVar75);
      uVar68 = (ulong)*(uint *)(uVar67 + 0xc + lVar74);
      lVar75 = lVar32 + uVar68 * 4;
      uVar76 = (ulong)*(uint *)(uVar67 + 0x1c + lVar74);
      uVar77 = (ulong)*(uint *)(uVar67 + 0x2c + lVar74);
      pfVar5 = (float *)(lVar32 + uVar77 * 4);
      fVar150 = pfVar5[1];
      uVar78 = (ulong)*(uint *)(uVar67 + 0x3c + lVar74);
      pfVar6 = (float *)(lVar32 + uVar78 * 4);
      lVar57 = (long)((int)fVar119 + 1) * 0x38;
      pGVar61 = *(Geometry **)(*(long *)&pGVar61[2].numPrimitives + lVar57);
      pfVar7 = (float *)((long)&(pGVar61->super_RefCount)._vptr_RefCount +
                        (ulong)*(uint *)(uVar67 + lVar74) * 4);
      local_12a8 = (undefined1 (*) [16])CONCAT44(pfVar5[2],pfVar20[2]);
      local_1408 = (float)uVar23;
      fStack_1404 = (float)((ulong)uVar23 >> 0x20);
      fStack_1400 = (float)uVar50;
      lVar29 = *(long *)(lVar29 + lVar57);
      pfVar8 = (float *)(lVar29 + uVar66 * 4);
      lVar27 = *(long *)(lVar27 + lVar57);
      pfVar9 = (float *)(lVar27 + (ulong)uVar60 * 4);
      lVar31 = *(long *)(lVar31 + lVar57);
      pfVar10 = (float *)(lVar31 + uVar68 * 4);
      pfVar11 = (float *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + (ulong)uVar120 * 4);
      pfVar12 = (float *)(lVar29 + uVar70 * 4);
      pfVar13 = (float *)(lVar27 + uVar63 * 4);
      pfVar14 = (float *)(lVar31 + uVar76 * 4);
      pfVar15 = (float *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + uVar56 * 4);
      fVar153 = *pfVar15;
      fVar243 = pfVar15[1];
      fVar181 = pfVar15[2];
      pfVar15 = (float *)(lVar29 + uVar71 * 4);
      fVar222 = *pfVar15;
      fVar217 = pfVar15[1];
      fVar215 = pfVar15[2];
      pfVar15 = (float *)(lVar27 + uVar64 * 4);
      fVar225 = *pfVar15;
      fVar219 = pfVar15[1];
      fVar180 = pfVar15[2];
      pfVar15 = (float *)(lVar31 + uVar77 * 4);
      fVar229 = *pfVar15;
      fVar234 = pfVar15[1];
      fVar241 = pfVar15[2];
      pfVar15 = (float *)((long)&(pGVar61->super_RefCount)._vptr_RefCount + uVar62 * 4);
      pfVar16 = (float *)(lVar29 + uVar72 * 4);
      pfVar17 = (float *)(lVar27 + uVar65 * 4);
      pfVar18 = (float *)(lVar31 + uVar78 * 4);
      fVar240 = 1.0 - fVar209;
      fVar198 = *pfVar4 * fVar240 + *pfVar11 * fVar209;
      fVar200 = *pfVar6 * fVar240 + *pfVar13 * fVar209;
      fVar202 = (float)local_12c8._8_4_ * fVar240 + *pfVar12 * fVar209;
      fVar204 = fStack_12bc * fVar240 + *pfVar14 * fVar209;
      local_1358 = *(float *)(lVar1 + 4) * fVar240 + pfVar11[1] * fVar209;
      fStack_1354 = *(float *)(lVar3 + 4) * fVar240 + pfVar13[1] * fVar209;
      fStack_1350 = *(float *)(lVar30 + uVar70 * 4 + 4) * fVar240 + pfVar12[1] * fVar209;
      fStack_134c = *(float *)(lVar32 + uVar76 * 4 + 4) * fVar240 + pfVar14[1] * fVar209;
      local_1298 = *(float *)(lVar1 + 8) * fVar240 + pfVar11[2] * fVar209;
      fStack_1294 = *(float *)(lVar3 + 8) * fVar240 + pfVar13[2] * fVar209;
      fStack_1340 = fStack_1340 * fVar240 + pfVar12[2] * fVar209;
      fStack_133c = fStack_133c * fVar240 + pfVar14[2] * fVar209;
      _local_1348 = CONCAT44(fStack_1294,local_1298);
      fVar189 = local_1408 * fVar240 + *pfVar15 * fVar209;
      fVar193 = *pfVar19 * fVar240 + *pfVar17 * fVar209;
      fVar195 = fStack_12d0 * fVar240 + *pfVar16 * fVar209;
      fVar197 = fStack_12cc * fVar240 + *pfVar18 * fVar209;
      local_fc8 = fStack_1404 * fVar240 + pfVar15[1] * fVar209;
      fStack_fc4 = pfVar19[1] * fVar240 + pfVar17[1] * fVar209;
      fStack_fc0 = pfVar4[1] * fVar240 + pfVar16[1] * fVar209;
      fStack_fbc = pfVar6[1] * fVar240 + pfVar18[1] * fVar209;
      fStack_13fc = (float)((ulong)uVar50 >> 0x20);
      local_fd8 = fVar240 * fStack_1400 + fVar209 * pfVar15[2];
      fStack_fd4 = fVar240 * pfVar19[2] + fVar209 * pfVar17[2];
      fStack_fd0 = fVar240 * fStack_1400 + fVar209 * pfVar16[2];
      fStack_fcc = fVar240 * fStack_13fc + fVar209 * pfVar18[2];
      fVar119 = *(float *)(ray + k * 4);
      fVar221 = *(float *)(ray + k * 4 + 0x10);
      fVar162 = (*pfVar20 * fVar240 + *pfVar7 * fVar209) - fVar119;
      fVar171 = (*pfVar5 * fVar240 + *pfVar9 * fVar209) - fVar119;
      fVar172 = (fStack_1420 * fVar240 + *pfVar8 * fVar209) - fVar119;
      fVar173 = (fStack_141c * fVar240 + *pfVar10 * fVar209) - fVar119;
      fVar199 = fVar198 - fVar119;
      fVar201 = fVar200 - fVar119;
      fVar203 = fVar202 - fVar119;
      fVar205 = fVar204 - fVar119;
      fVar190 = fVar189 - fVar119;
      fVar194 = fVar193 - fVar119;
      fVar196 = fVar195 - fVar119;
      fVar119 = fVar197 - fVar119;
      fVar208 = *(float *)(ray + k * 4 + 0x20);
      fVar227 = (*(float *)(lVar58 + 4) * fVar240 + pfVar7[1] * fVar209) - fVar221;
      fVar232 = (*(float *)(lVar26 + 4) * fVar240 + pfVar9[1] * fVar209) - fVar221;
      fVar235 = (*(float *)(lVar28 + 4) * fVar240 + pfVar8[1] * fVar209) - fVar221;
      fVar237 = (*(float *)(lVar75 + 4) * fVar240 + pfVar10[1] * fVar209) - fVar221;
      fVar136 = (*(float *)(lVar58 + 8) * fVar240 + pfVar7[2] * fVar209) - fVar208;
      fVar146 = (*(float *)(lVar26 + 8) * fVar240 + pfVar9[2] * fVar209) - fVar208;
      fVar148 = (*(float *)(lVar28 + 8) * fVar240 + pfVar8[2] * fVar209) - fVar208;
      fVar151 = (*(float *)(lVar75 + 8) * fVar240 + pfVar10[2] * fVar209) - fVar208;
      local_1368 = local_fc8 - fVar221;
      fStack_1364 = fStack_fc4 - fVar221;
      fStack_1360 = fStack_fc0 - fVar221;
      fStack_135c = fStack_fbc - fVar221;
      local_13c8 = local_fd8 - fVar208;
      fStack_13c4 = fStack_fd4 - fVar208;
      fStack_13c0 = fStack_fd0 - fVar208;
      fStack_13bc = fStack_fcc - fVar208;
      local_1378._0_4_ = fVar190 - fVar162;
      local_1378._4_4_ = fVar194 - fVar171;
      fStack_1370 = fVar196 - fVar172;
      fStack_136c = fVar119 - fVar173;
      fVar210 = local_1368 - fVar227;
      fVar213 = fStack_1364 - fVar232;
      fStack_1180 = fStack_1360 - fVar235;
      fStack_117c = fStack_135c - fVar237;
      fVar206 = local_13c8 - fVar136;
      fVar207 = fStack_13c4 - fVar146;
      fStack_1170 = fStack_13c0 - fVar148;
      fStack_116c = fStack_13bc - fVar151;
      _local_1178 = CONCAT44(fVar207,fVar206);
      _local_1188 = CONCAT44(fVar213,fVar210);
      fVar220 = *(float *)(ray + k * 4 + 0x50);
      fStack_1394 = *(float *)(ray + k * 4 + 0x60);
      fStack_13a4 = *(float *)(ray + k * 4 + 0x40);
      local_ff8 = (fVar210 * (local_13c8 + fVar136) - (local_1368 + fVar227) * fVar206) *
                  fStack_13a4 +
                  ((fVar190 + fVar162) * fVar206 - (local_13c8 + fVar136) * (float)local_1378._0_4_)
                  * fVar220 +
                  ((float)local_1378._0_4_ * (local_1368 + fVar227) - (fVar190 + fVar162) * fVar210)
                  * fStack_1394;
      fStack_ff4 = (fVar213 * (fStack_13c4 + fVar146) - (fStack_1364 + fVar232) * fVar207) *
                   fStack_13a4 +
                   ((fVar194 + fVar171) * fVar207 -
                   (fStack_13c4 + fVar146) * (float)local_1378._4_4_) * fVar220 +
                   ((float)local_1378._4_4_ * (fStack_1364 + fVar232) -
                   (fVar194 + fVar171) * fVar213) * fStack_1394;
      fStack_ff0 = (fStack_1180 * (fStack_13c0 + fVar148) - (fStack_1360 + fVar235) * fStack_1170) *
                   fStack_13a4 +
                   ((fVar196 + fVar172) * fStack_1170 - (fStack_13c0 + fVar148) * fStack_1370) *
                   fVar220 + (fStack_1370 * (fStack_1360 + fVar235) -
                             (fVar196 + fVar172) * fStack_1180) * fStack_1394;
      fStack_fec = (fStack_117c * (fStack_13bc + fVar151) - (fStack_135c + fVar237) * fStack_116c) *
                   fStack_13a4 +
                   ((fVar119 + fVar173) * fStack_116c - (fStack_13bc + fVar151) * fStack_136c) *
                   fVar220 + (fStack_136c * (fStack_135c + fVar237) -
                             (fVar119 + fVar173) * fStack_117c) * fStack_1394;
      fVar81 = local_1358 - fVar221;
      fVar112 = fStack_1354 - fVar221;
      fVar114 = fStack_1350 - fVar221;
      fVar226 = fStack_134c - fVar221;
      local_1298 = local_1298 - fVar208;
      fStack_1294 = fStack_1294 - fVar208;
      fStack_1290 = fStack_1340 - fVar208;
      fStack_128c = fStack_133c - fVar208;
      local_fa8 = fVar162 - fVar199;
      fStack_fa4 = fVar171 - fVar201;
      fStack_fa0 = fVar172 - fVar203;
      fStack_f9c = fVar173 - fVar205;
      fVar228 = fVar227 - fVar81;
      fVar233 = fVar232 - fVar112;
      fVar236 = fVar235 - fVar114;
      fVar238 = fVar237 - fVar226;
      local_f98 = fVar136 - local_1298;
      fStack_f94 = fVar146 - fStack_1294;
      fStack_f90 = fVar148 - fStack_1290;
      fStack_f8c = fVar151 - fStack_128c;
      local_fe8 = (fVar228 * (fVar136 + local_1298) - (fVar227 + fVar81) * local_f98) * fStack_13a4
                  + ((fVar162 + fVar199) * local_f98 - (fVar136 + local_1298) * local_fa8) * fVar220
                    + (local_fa8 * (fVar227 + fVar81) - (fVar162 + fVar199) * fVar228) * fStack_1394
      ;
      fStack_fe4 = (fVar233 * (fVar146 + fStack_1294) - (fVar232 + fVar112) * fStack_f94) *
                   fStack_13a4 +
                   ((fVar171 + fVar201) * fStack_f94 - (fVar146 + fStack_1294) * fStack_fa4) *
                   fVar220 + (fStack_fa4 * (fVar232 + fVar112) - (fVar171 + fVar201) * fVar233) *
                             fStack_1394;
      fStack_fe0 = (fVar236 * (fVar148 + fStack_1290) - (fVar235 + fVar114) * fStack_f90) *
                   fStack_13a4 +
                   ((fVar172 + fVar203) * fStack_f90 - (fVar148 + fStack_1290) * fStack_fa0) *
                   fVar220 + (fStack_fa0 * (fVar235 + fVar114) - (fVar172 + fVar203) * fVar236) *
                             fStack_1394;
      fStack_fdc = (fVar238 * (fVar151 + fStack_128c) - (fVar237 + fVar226) * fStack_f8c) *
                   fStack_13a4 +
                   ((fVar173 + fVar205) * fStack_f8c - (fVar151 + fStack_128c) * fStack_f9c) *
                   fVar220 + (fStack_f9c * (fVar237 + fVar226) - (fVar173 + fVar205) * fVar238) *
                             fStack_1394;
      fVar137 = fVar199 - fVar190;
      fVar239 = fVar201 - fVar194;
      fVar149 = fVar203 - fVar196;
      fVar152 = fVar205 - fVar119;
      fVar211 = fVar81 - local_1368;
      fVar214 = fVar112 - fStack_1364;
      fVar216 = fVar114 - fStack_1360;
      fVar218 = fVar226 - fStack_135c;
      local_f88 = local_1298 - local_13c8;
      fStack_f84 = fStack_1294 - fStack_13c4;
      fStack_f80 = fStack_1290 - fStack_13c0;
      fStack_f7c = fStack_128c - fStack_13bc;
      local_1288 = fVar81 + local_1368;
      fStack_1284 = fVar112 + fStack_1364;
      fStack_1280 = fVar114 + fStack_1360;
      fStack_127c = fVar226 + fStack_135c;
      local_1278 = local_1298 + local_13c8;
      fStack_1274 = fStack_1294 + fStack_13c4;
      fStack_1270 = fStack_1290 + fStack_13c0;
      fStack_126c = fStack_128c + fStack_13bc;
      auVar121._0_4_ =
           (fVar211 * local_1278 - local_1288 * local_f88) * fStack_13a4 +
           ((fVar190 + fVar199) * local_f88 - fVar137 * local_1278) * fVar220 +
           (fVar137 * local_1288 - (fVar190 + fVar199) * fVar211) * fStack_1394;
      auVar121._4_4_ =
           (fVar214 * fStack_1274 - fStack_1284 * fStack_f84) * fStack_13a4 +
           ((fVar194 + fVar201) * fStack_f84 - fVar239 * fStack_1274) * fVar220 +
           (fVar239 * fStack_1284 - (fVar194 + fVar201) * fVar214) * fStack_1394;
      auVar121._8_4_ =
           (fVar216 * fStack_1270 - fStack_1280 * fStack_f80) * fStack_13a4 +
           ((fVar196 + fVar203) * fStack_f80 - fVar149 * fStack_1270) * fVar220 +
           (fVar149 * fStack_1280 - (fVar196 + fVar203) * fVar216) * fStack_1394;
      auVar121._12_4_ =
           (fVar218 * fStack_126c - fStack_127c * fStack_f7c) * fStack_13a4 +
           ((fVar119 + fVar205) * fStack_f7c - fVar152 * fStack_126c) * fVar220 +
           (fVar152 * fStack_127c - (fVar119 + fVar205) * fVar218) * fStack_1394;
      fVar199 = local_ff8 + local_fe8 + auVar121._0_4_;
      fVar201 = fStack_ff4 + fStack_fe4 + auVar121._4_4_;
      fVar203 = fStack_ff0 + fStack_fe0 + auVar121._8_4_;
      fVar205 = fStack_fec + fStack_fdc + auVar121._12_4_;
      auVar91._4_4_ = fStack_ff4;
      auVar91._0_4_ = local_ff8;
      auVar91._8_4_ = fStack_ff0;
      auVar91._12_4_ = fStack_fec;
      auVar39._4_4_ = fStack_fe4;
      auVar39._0_4_ = local_fe8;
      auVar39._8_4_ = fStack_fe0;
      auVar39._12_4_ = fStack_fdc;
      auVar142 = minps(auVar91,auVar39);
      auVar142 = minps(auVar142,auVar121);
      auVar184._4_4_ = fStack_ff4;
      auVar184._0_4_ = local_ff8;
      auVar184._8_4_ = fStack_ff0;
      auVar184._12_4_ = fStack_fec;
      auVar40._4_4_ = fStack_fe4;
      auVar40._0_4_ = local_fe8;
      auVar40._8_4_ = fStack_fe0;
      auVar40._12_4_ = fStack_fdc;
      auVar185 = maxps(auVar184,auVar40);
      auVar185 = maxps(auVar185,auVar121);
      fVar119 = ABS(fVar199) * 1.1920929e-07;
      fVar190 = ABS(fVar201) * 1.1920929e-07;
      fVar194 = ABS(fVar203) * 1.1920929e-07;
      fVar196 = ABS(fVar205) * 1.1920929e-07;
      auVar186._4_4_ = -(uint)(auVar185._4_4_ <= fVar190);
      auVar186._0_4_ = -(uint)(auVar185._0_4_ <= fVar119);
      auVar186._8_4_ = -(uint)(auVar185._8_4_ <= fVar194);
      auVar186._12_4_ = -(uint)(auVar185._12_4_ <= fVar196);
      auVar92._4_4_ = -(uint)(-fVar190 <= auVar142._4_4_);
      auVar92._0_4_ = -(uint)(-fVar119 <= auVar142._0_4_);
      auVar92._8_4_ = -(uint)(-fVar194 <= auVar142._8_4_);
      auVar92._12_4_ = -(uint)(-fVar196 <= auVar142._12_4_);
      auVar186 = auVar186 | auVar92;
      lVar74 = uVar67 + lVar74;
      iVar54 = movmskps((int)lVar74,auVar186);
      if (iVar54 == 0) {
LAB_0071f4a1:
        uVar60 = 0;
        auVar167._4_4_ = fVar221;
        auVar167._0_4_ = fVar221;
        auVar167._8_4_ = fVar221;
        auVar167._12_4_ = fVar221;
      }
      else {
        local_1008 = fVar199;
        fStack_1004 = fVar201;
        fStack_1000 = fVar203;
        fStack_ffc = fVar205;
        local_fb8 = fVar211;
        fStack_fb4 = fVar214;
        fStack_fb0 = fVar216;
        fStack_fac = fVar218;
        auVar166._0_4_ = fVar210 * local_f98 - fVar228 * fVar206;
        auVar166._4_4_ = fVar213 * fStack_f94 - fVar233 * fVar207;
        auVar166._8_4_ = fStack_1180 * fStack_f90 - fVar236 * fStack_1170;
        auVar166._12_4_ = fStack_117c * fStack_f8c - fVar238 * fStack_116c;
        auVar230._0_4_ = fVar228 * local_f88 - fVar211 * local_f98;
        auVar230._4_4_ = fVar233 * fStack_f84 - fVar214 * fStack_f94;
        auVar230._8_4_ = fVar236 * fStack_f80 - fVar216 * fStack_f90;
        auVar230._12_4_ = fVar238 * fStack_f7c - fVar218 * fStack_f8c;
        auVar93._4_4_ = -(uint)(ABS(fVar233 * fVar207) < ABS(fVar214 * fStack_f94));
        auVar93._0_4_ = -(uint)(ABS(fVar228 * fVar206) < ABS(fVar211 * local_f98));
        auVar93._8_4_ = -(uint)(ABS(fVar236 * fStack_1170) < ABS(fVar216 * fStack_f90));
        auVar93._12_4_ = -(uint)(ABS(fVar238 * fStack_116c) < ABS(fVar218 * fStack_f8c));
        local_11c8 = blendvps(auVar230,auVar166,auVar93);
        auVar178._0_4_ = fVar137 * local_f98 - local_fa8 * local_f88;
        auVar178._4_4_ = fVar239 * fStack_f94 - fStack_fa4 * fStack_f84;
        auVar178._8_4_ = fVar149 * fStack_f90 - fStack_fa0 * fStack_f80;
        auVar178._12_4_ = fVar152 * fStack_f8c - fStack_f9c * fStack_f7c;
        auVar94._4_4_ =
             -(uint)(ABS((float)local_1378._4_4_ * fStack_f94) < ABS(fStack_fa4 * fStack_f84));
        auVar94._0_4_ =
             -(uint)(ABS((float)local_1378._0_4_ * local_f98) < ABS(local_fa8 * local_f88));
        auVar94._8_4_ = -(uint)(ABS(fStack_1370 * fStack_f90) < ABS(fStack_fa0 * fStack_f80));
        auVar94._12_4_ = -(uint)(ABS(fStack_136c * fStack_f8c) < ABS(fStack_f9c * fStack_f7c));
        auVar47._4_4_ = fVar207 * fStack_fa4 - (float)local_1378._4_4_ * fStack_f94;
        auVar47._0_4_ = fVar206 * local_fa8 - (float)local_1378._0_4_ * local_f98;
        auVar47._8_4_ = fStack_1170 * fStack_fa0 - fStack_1370 * fStack_f90;
        auVar47._12_4_ = fStack_116c * fStack_f9c - fStack_136c * fStack_f8c;
        local_11b8 = blendvps(auVar178,auVar47,auVar94);
        auVar191._0_4_ = local_fa8 * fVar211 - fVar137 * fVar228;
        auVar191._4_4_ = fStack_fa4 * fVar214 - fVar239 * fVar233;
        auVar191._8_4_ = fStack_fa0 * fVar216 - fVar149 * fVar236;
        auVar191._12_4_ = fStack_f9c * fVar218 - fVar152 * fVar238;
        auVar95._4_4_ = -(uint)(ABS(fStack_fa4 * fVar213) < ABS(fVar239 * fVar233));
        auVar95._0_4_ = -(uint)(ABS(local_fa8 * fVar210) < ABS(fVar137 * fVar228));
        auVar95._8_4_ = -(uint)(ABS(fStack_fa0 * fStack_1180) < ABS(fVar149 * fVar236));
        auVar95._12_4_ = -(uint)(ABS(fStack_f9c * fStack_117c) < ABS(fVar152 * fVar238));
        auVar41._4_4_ = (float)local_1378._4_4_ * fVar233 - fStack_fa4 * fVar213;
        auVar41._0_4_ = (float)local_1378._0_4_ * fVar228 - local_fa8 * fVar210;
        auVar41._8_4_ = fStack_1370 * fVar236 - fStack_fa0 * fStack_1180;
        auVar41._12_4_ = fStack_136c * fVar238 - fStack_f9c * fStack_117c;
        local_11a8 = blendvps(auVar191,auVar41,auVar95);
        fVar119 = fStack_13a4 * local_11c8._0_4_ +
                  fVar220 * local_11b8._0_4_ + fStack_1394 * local_11a8._0_4_;
        fVar190 = fStack_13a4 * local_11c8._4_4_ +
                  fVar220 * local_11b8._4_4_ + fStack_1394 * local_11a8._4_4_;
        fVar194 = fStack_13a4 * local_11c8._8_4_ +
                  fVar220 * local_11b8._8_4_ + fStack_1394 * local_11a8._8_4_;
        fVar196 = fStack_13a4 * local_11c8._12_4_ +
                  fVar220 * local_11b8._12_4_ + fStack_1394 * local_11a8._12_4_;
        auVar96._0_4_ = fVar119 + fVar119;
        auVar96._4_4_ = fVar190 + fVar190;
        auVar96._8_4_ = fVar194 + fVar194;
        auVar96._12_4_ = fVar196 + fVar196;
        auVar122._0_4_ = fVar136 * local_11a8._0_4_;
        auVar122._4_4_ = fVar146 * local_11a8._4_4_;
        auVar122._8_4_ = fVar148 * local_11a8._8_4_;
        auVar122._12_4_ = fVar151 * local_11a8._12_4_;
        fVar136 = fVar162 * local_11c8._0_4_ + fVar227 * local_11b8._0_4_ + auVar122._0_4_;
        fVar137 = fVar171 * local_11c8._4_4_ + fVar232 * local_11b8._4_4_ + auVar122._4_4_;
        fVar146 = fVar172 * local_11c8._8_4_ + fVar235 * local_11b8._8_4_ + auVar122._8_4_;
        fVar239 = fVar173 * local_11c8._12_4_ + fVar237 * local_11b8._12_4_ + auVar122._12_4_;
        auVar142 = rcpps(auVar122,auVar96);
        fVar119 = auVar142._0_4_;
        fVar190 = auVar142._4_4_;
        fVar194 = auVar142._8_4_;
        fVar196 = auVar142._12_4_;
        fVar136 = ((1.0 - auVar96._0_4_ * fVar119) * fVar119 + fVar119) * (fVar136 + fVar136);
        fVar137 = ((1.0 - auVar96._4_4_ * fVar190) * fVar190 + fVar190) * (fVar137 + fVar137);
        fVar194 = ((1.0 - auVar96._8_4_ * fVar194) * fVar194 + fVar194) * (fVar146 + fVar146);
        fVar196 = ((1.0 - auVar96._12_4_ * fVar196) * fVar196 + fVar196) * (fVar239 + fVar239);
        fVar119 = *(float *)(ray + k * 4 + 0x80);
        _local_1378 = ZEXT416((uint)fVar119);
        fVar190 = *(float *)(ray + k * 4 + 0x30);
        auVar123._0_4_ = -(uint)(fVar136 <= fVar119 && fVar190 <= fVar136) & auVar186._0_4_;
        auVar123._4_4_ = -(uint)(fVar137 <= fVar119 && fVar190 <= fVar137) & auVar186._4_4_;
        auVar123._8_4_ = -(uint)(fVar194 <= fVar119 && fVar190 <= fVar194) & auVar186._8_4_;
        auVar123._12_4_ = -(uint)(fVar196 <= fVar119 && fVar190 <= fVar196) & auVar186._12_4_;
        iVar54 = movmskps(iVar54,auVar123);
        if (iVar54 == 0) goto LAB_0071f4a1;
        uVar120 = auVar123._0_4_ & -(uint)(auVar96._0_4_ != 0.0);
        uVar135 = auVar123._4_4_ & -(uint)(auVar96._4_4_ != 0.0);
        valid.field_0._0_8_ = CONCAT44(uVar135,uVar120);
        valid.field_0.i[2] = auVar123._8_4_ & -(uint)(auVar96._8_4_ != 0.0);
        valid.field_0.i[3] = auVar123._12_4_ & -(uint)(auVar96._12_4_ != 0.0);
        uVar60 = movmskps(iVar54,(undefined1  [16])valid.field_0);
        auVar167._4_4_ = fVar221;
        auVar167._0_4_ = fVar221;
        auVar167._8_4_ = fVar221;
        auVar167._12_4_ = fVar221;
        if (uVar60 != 0) {
          tNear.field_0.v[1] = fStack_ff4;
          tNear.field_0.v[0] = local_ff8;
          tNear.field_0.v[2] = fStack_ff0;
          tNear.field_0.v[3] = fStack_fec;
          auVar52._4_4_ = fVar201;
          auVar52._0_4_ = fVar199;
          auVar52._8_4_ = fVar203;
          auVar52._12_4_ = fVar205;
          local_11d8._4_4_ = fVar137;
          local_11d8._0_4_ = fVar136;
          fStack_11d0 = fVar194;
          fStack_11cc = fVar196;
          local_1198._8_8_ = uStack_1090;
          local_1198._0_8_ = local_1098;
          auVar142 = rcpps(auVar167,auVar52);
          fVar221 = auVar142._0_4_;
          fVar208 = auVar142._4_4_;
          fVar220 = auVar142._8_4_;
          fVar226 = auVar142._12_4_;
          fVar81 = (float)DAT_01f46a60;
          fVar112 = DAT_01f46a60._4_4_;
          fVar114 = DAT_01f46a60._12_4_;
          fVar119 = DAT_01f46a60._8_4_;
          fVar221 = (float)(-(uint)(1e-18 <= ABS(fVar199)) &
                           (uint)((fVar81 - fVar199 * fVar221) * fVar221 + fVar221));
          fVar208 = (float)(-(uint)(1e-18 <= ABS(fVar201)) &
                           (uint)((fVar112 - fVar201 * fVar208) * fVar208 + fVar208));
          fVar220 = (float)(-(uint)(1e-18 <= ABS(fVar203)) &
                           (uint)((fVar119 - fVar203 * fVar220) * fVar220 + fVar220));
          fVar226 = (float)(-(uint)(1e-18 <= ABS(fVar205)) &
                           (uint)((fVar114 - fVar205 * fVar226) * fVar226 + fVar226));
          auVar187._0_4_ = local_ff8 * fVar221;
          auVar187._4_4_ = fStack_ff4 * fVar208;
          auVar187._8_4_ = fStack_ff0 * fVar220;
          auVar187._12_4_ = fStack_fec * fVar226;
          auVar142 = minps(auVar187,_DAT_01f46a60);
          auVar223._0_4_ = fVar221 * local_fe8;
          auVar223._4_4_ = fVar208 * fStack_fe4;
          auVar223._8_4_ = fVar220 * fStack_fe0;
          auVar223._12_4_ = fVar226 * fStack_fdc;
          auVar185 = minps(auVar223,_DAT_01f46a60);
          auVar144._0_4_ = fVar81 - auVar142._0_4_;
          auVar144._4_4_ = fVar112 - auVar142._4_4_;
          auVar144._8_4_ = fVar119 - auVar142._8_4_;
          auVar144._12_4_ = fVar114 - auVar142._12_4_;
          auVar157._0_4_ = fVar81 - auVar185._0_4_;
          auVar157._4_4_ = fVar112 - auVar185._4_4_;
          auVar157._8_4_ = fVar119 - auVar185._8_4_;
          auVar157._12_4_ = fVar114 - auVar185._12_4_;
          local_11f8 = blendvps(auVar142,auVar144,local_1198);
          local_11e8 = blendvps(auVar185,auVar157,local_1198);
          auVar97._8_4_ = valid.field_0.i[2];
          auVar97._0_8_ = valid.field_0._0_8_;
          auVar97._12_4_ = valid.field_0.i[3];
          auVar185 = blendvps(_DAT_01f45a30,_local_11d8,auVar97);
          auVar158._4_4_ = auVar185._0_4_;
          auVar158._0_4_ = auVar185._4_4_;
          auVar158._8_4_ = auVar185._12_4_;
          auVar158._12_4_ = auVar185._8_4_;
          auVar142 = minps(auVar158,auVar185);
          auVar98._0_8_ = auVar142._8_8_;
          auVar98._8_4_ = auVar142._0_4_;
          auVar98._12_4_ = auVar142._4_4_;
          auVar142 = minps(auVar98,auVar142);
          auVar99._0_8_ =
               CONCAT44(-(uint)(auVar142._4_4_ == auVar185._4_4_) & uVar135,
                        -(uint)(auVar142._0_4_ == auVar185._0_4_) & uVar120);
          auVar99._8_4_ = -(uint)(auVar142._8_4_ == auVar185._8_4_) & valid.field_0.i[2];
          auVar99._12_4_ = -(uint)(auVar142._12_4_ == auVar185._12_4_) & valid.field_0.i[3];
          iVar54 = movmskps(uVar60,auVar99);
          aVar124 = valid.field_0;
          if (iVar54 != 0) {
            aVar124.i[2] = auVar99._8_4_;
            aVar124._0_8_ = auVar99._0_8_;
            aVar124.i[3] = auVar99._12_4_;
          }
          uVar55 = movmskps(iVar54,(undefined1  [16])aVar124);
          uVar56 = CONCAT44((int)((ulong)lVar74 >> 0x20),uVar55);
          lVar58 = 0;
          if (uVar56 != 0) {
            for (; (uVar56 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
            }
          }
LAB_0071e466:
          uVar60 = *(uint *)(lVar74 + 0x40 + lVar58 * 4);
          pGVar33 = (pSVar24->geometries).items[uVar60].ptr;
          pGVar61 = (Geometry *)(ulong)*(uint *)(ray + k * 4 + 0x90);
          if ((pGVar33->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
            valid.field_0.v[lVar58] = 0.0;
LAB_0071e7c6:
            uVar60 = movmskps((int)lVar58,(undefined1  [16])valid.field_0);
            if (uVar60 == 0) goto LAB_0071e92f;
            auVar43._4_4_ = fVar137;
            auVar43._0_4_ = fVar136;
            auVar43._8_4_ = fVar194;
            auVar43._12_4_ = fVar196;
            auVar185 = blendvps(_DAT_01f45a30,auVar43,(undefined1  [16])valid.field_0);
            auVar159._4_4_ = auVar185._0_4_;
            auVar159._0_4_ = auVar185._4_4_;
            auVar159._8_4_ = auVar185._12_4_;
            auVar159._12_4_ = auVar185._8_4_;
            auVar142 = minps(auVar159,auVar185);
            auVar126._0_8_ = auVar142._8_8_;
            auVar126._8_4_ = auVar142._0_4_;
            auVar126._12_4_ = auVar142._4_4_;
            auVar142 = minps(auVar126,auVar142);
            auVar127._0_8_ =
                 CONCAT44(-(uint)(auVar142._4_4_ == auVar185._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar142._0_4_ == auVar185._0_4_) & valid.field_0._0_4_);
            auVar127._8_4_ = -(uint)(auVar142._8_4_ == auVar185._8_4_) & valid.field_0._8_4_;
            auVar127._12_4_ = -(uint)(auVar142._12_4_ == auVar185._12_4_) & valid.field_0._12_4_;
            iVar54 = movmskps(uVar60,auVar127);
            aVar101 = valid.field_0;
            if (iVar54 != 0) {
              aVar101.i[2] = auVar127._8_4_;
              aVar101._0_8_ = auVar127._0_8_;
              aVar101.i[3] = auVar127._12_4_;
            }
            uVar55 = movmskps(iVar54,(undefined1  [16])aVar101);
            uVar56 = CONCAT44((int)((ulong)lVar58 >> 0x20),uVar55);
            lVar58 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
              }
            }
            goto LAB_0071e466;
          }
          if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
             (pGVar33->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
            local_1108 = *(undefined4 *)(local_11f8 + lVar58 * 4);
            local_10f8 = *(undefined4 *)(local_11e8 + lVar58 * 4);
            local_1138._4_4_ = *(undefined4 *)(local_11c8 + lVar58 * 4);
            local_1128._4_4_ = *(undefined4 *)(local_11b8 + lVar58 * 4);
            local_10d8._4_4_ = uVar60;
            local_10d8._0_4_ = uVar60;
            local_10d8._8_4_ = uVar60;
            local_10d8._12_4_ = uVar60;
            uVar55 = *(undefined4 *)(lVar74 + 0x50 + lVar58 * 4);
            local_10e8._4_4_ = uVar55;
            local_10e8._0_4_ = uVar55;
            local_10e8._8_4_ = uVar55;
            local_10e8._12_4_ = uVar55;
            uVar55 = *(undefined4 *)(local_11a8 + lVar58 * 4);
            local_1118._4_4_ = uVar55;
            local_1118._0_4_ = uVar55;
            local_1118._8_4_ = uVar55;
            local_1118._12_4_ = uVar55;
            local_1138._0_4_ = local_1138._4_4_;
            local_1138._8_4_ = local_1138._4_4_;
            local_1138._12_4_ = local_1138._4_4_;
            local_1128._0_4_ = local_1128._4_4_;
            local_1128._8_4_ = local_1128._4_4_;
            local_1128._12_4_ = local_1128._4_4_;
            uStack_1104 = local_1108;
            uStack_1100 = local_1108;
            uStack_10fc = local_1108;
            uStack_10f4 = local_10f8;
            uStack_10f0 = local_10f8;
            uStack_10ec = local_10f8;
            local_10c8 = context->user->instID[0];
            uStack_10c4 = local_10c8;
            uStack_10c0 = local_10c8;
            uStack_10bc = local_10c8;
            local_10b8 = context->user->instPrimID[0];
            uStack_10b4 = local_10b8;
            uStack_10b0 = local_10b8;
            uStack_10ac = local_10b8;
            *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar58 * 4);
            local_1388 = *local_12a8;
            args.valid = (int *)local_1388;
            args.geometryUserPtr = pGVar33->userPtr;
            args.context = context->user;
            args.hit = (RTCHitN *)local_1138;
            args.N = 4;
            pGVar61 = pGVar33;
            args.ray = (RTCRayN *)ray;
            if (pGVar33->intersectionFilterN != (RTCFilterFunctionN)0x0) {
              (*pGVar33->intersectionFilterN)(&args);
            }
            if (local_1388 == (undefined1  [16])0x0) {
              auVar125._8_4_ = 0xffffffff;
              auVar125._0_8_ = 0xffffffffffffffff;
              auVar125._12_4_ = 0xffffffff;
              auVar125 = auVar125 ^ _DAT_01f46b70;
            }
            else {
              pGVar34 = (Geometry *)context->args;
              pGVar61 = pGVar34;
              if ((pGVar34->device != (Device *)0x0) &&
                 ((((ulong)(pGVar34->super_RefCount)._vptr_RefCount & 2) != 0 ||
                  (pGVar61 = pGVar33, ((pGVar33->field_8).field_0x2 & 0x40) != 0)))) {
                (*(code *)pGVar34->device)(&args);
              }
              auVar100._0_4_ = -(uint)(local_1388._0_4_ == 0);
              auVar100._4_4_ = -(uint)(local_1388._4_4_ == 0);
              auVar100._8_4_ = -(uint)(local_1388._8_4_ == 0);
              auVar100._12_4_ = -(uint)(local_1388._12_4_ == 0);
              auVar125 = auVar100 ^ _DAT_01f46b70;
              if (local_1388 != (undefined1  [16])0x0) {
                auVar142 = blendvps(*(undefined1 (*) [16])args.hit,
                                    *(undefined1 (*) [16])(args.ray + 0xc0),auVar100);
                *(undefined1 (*) [16])(args.ray + 0xc0) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                    *(undefined1 (*) [16])(args.ray + 0xd0),auVar100);
                *(undefined1 (*) [16])(args.ray + 0xd0) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                    *(undefined1 (*) [16])(args.ray + 0xe0),auVar100);
                *(undefined1 (*) [16])(args.ray + 0xe0) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                    *(undefined1 (*) [16])(args.ray + 0xf0),auVar100);
                *(undefined1 (*) [16])(args.ray + 0xf0) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                    *(undefined1 (*) [16])(args.ray + 0x100),auVar100);
                *(undefined1 (*) [16])(args.ray + 0x100) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                    *(undefined1 (*) [16])(args.ray + 0x110),auVar100);
                *(undefined1 (*) [16])(args.ray + 0x110) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                    *(undefined1 (*) [16])(args.ray + 0x120),auVar100);
                *(undefined1 (*) [16])(args.ray + 0x120) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                    *(undefined1 (*) [16])(args.ray + 0x130),auVar100);
                *(undefined1 (*) [16])(args.ray + 0x130) = auVar142;
                auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                    *(undefined1 (*) [16])(args.ray + 0x140),auVar100);
                *(undefined1 (*) [16])(args.ray + 0x140) = auVar142;
                pGVar61 = (Geometry *)args.hit;
              }
            }
            if ((_DAT_01f46b40 & auVar125) == (undefined1  [16])0x0) {
              *(undefined4 *)(ray + k * 4 + 0x80) = local_1378._0_4_;
              fVar119 = (float)local_1378._0_4_;
              uVar55 = local_1378._4_4_;
              fVar221 = fStack_1370;
              fVar208 = fStack_136c;
            }
            else {
              fVar119 = *(float *)(ray + k * 4 + 0x80);
              uVar55 = 0;
              fVar221 = (float)0;
              fVar208 = (float)0;
            }
            valid.field_0.v[lVar58] = 0.0;
            local_1378._4_4_ = uVar55;
            local_1378._0_4_ = fVar119;
            fStack_1370 = fVar221;
            fStack_136c = fVar208;
            valid.field_0.i[0] = -(uint)(fVar136 <= fVar119) & valid.field_0.i[0];
            valid.field_0.i[1] = -(uint)(fVar137 <= fVar119) & valid.field_0.i[1];
            valid.field_0.i[2] = -(uint)(fVar194 <= fVar119) & valid.field_0.i[2];
            valid.field_0.i[3] = -(uint)(fVar196 <= fVar119) & valid.field_0.i[3];
            goto LAB_0071e7c6;
          }
          uVar55 = *(undefined4 *)(local_11f8 + lVar58 * 4);
          uVar21 = *(undefined4 *)(local_11e8 + lVar58 * 4);
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar58 * 4);
          *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11c8 + lVar58 * 4);
          *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11b8 + lVar58 * 4);
          *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11a8 + lVar58 * 4);
          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar55;
          *(undefined4 *)(ray + k * 4 + 0x100) = uVar21;
          uVar120 = *(uint *)(lVar74 + 0x50 + lVar58 * 4);
          pGVar61 = (Geometry *)(ulong)uVar120;
          *(uint *)(ray + k * 4 + 0x110) = uVar120;
          *(uint *)(ray + k * 4 + 0x120) = uVar60;
          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
          uVar60 = context->user->instPrimID[0];
          *(uint *)(ray + k * 4 + 0x140) = uVar60;
LAB_0071e92f:
          fVar226 = *(float *)(ray + k * 4 + 0x10);
          fVar208 = *(float *)(ray + k * 4 + 0x20);
          fStack_13a4 = *(float *)(ray + k * 4 + 0x40);
          fVar220 = *(float *)(ray + k * 4 + 0x50);
          auVar167._4_4_ = fVar226;
          auVar167._0_4_ = fVar226;
          auVar167._8_4_ = fVar226;
          auVar167._12_4_ = fVar226;
          fStack_1394 = *(float *)(ray + k * 4 + 0x60);
          local_1368 = local_fc8 - fVar226;
          fStack_1364 = fStack_fc4 - fVar226;
          fStack_1360 = fStack_fc0 - fVar226;
          fStack_135c = fStack_fbc - fVar226;
          local_13c8 = local_fd8 - fVar208;
          fStack_13c4 = fStack_fd4 - fVar208;
          fStack_13c0 = fStack_fd0 - fVar208;
          fStack_13bc = fStack_fcc - fVar208;
          fVar81 = local_1358 - fVar226;
          fVar112 = fStack_1354 - fVar226;
          fVar114 = fStack_1350 - fVar226;
          fVar226 = fStack_134c - fVar226;
          local_1298 = local_1348 - fVar208;
          fStack_1294 = fStack_1344 - fVar208;
          fStack_1290 = fStack_1340 - fVar208;
          fStack_128c = fStack_133c - fVar208;
          local_1288 = local_1368 + fVar81;
          fStack_1284 = fStack_1364 + fVar112;
          fStack_1280 = fStack_1360 + fVar114;
          fStack_127c = fStack_135c + fVar226;
          local_1278 = local_13c8 + local_1298;
          fStack_1274 = fStack_13c4 + fStack_1294;
          fStack_1270 = fStack_13c0 + fStack_1290;
          fStack_126c = fStack_13bc + fStack_128c;
        }
      }
      fVar181 = (fVar116 * fVar240 + fVar181 * fVar209) - fVar208;
      fVar180 = (fVar138 * fVar240 + fVar180 * fVar209) - fVar208;
      fStack_12b0 = (fStack_12b0 * fVar240 + fVar215 * fVar209) - fVar208;
      fStack_12ac = (fStack_12ac * fVar240 + fVar241 * fVar209) - fVar208;
      fVar243 = (fVar115 * fVar240 + fVar243 * fVar209) - auVar167._0_4_;
      fVar215 = (fVar118 * fVar240 + fVar219 * fVar209) - auVar167._4_4_;
      fVar217 = (fVar147 * fVar240 + fVar217 * fVar209) - auVar167._8_4_;
      fVar219 = (fVar150 * fVar240 + fVar234 * fVar209) - auVar167._12_4_;
      fVar119 = *(float *)(ray + k * 4);
      fVar241 = (fVar113 * fVar240 + fVar153 * fVar209) - fVar119;
      fVar194 = (fVar117 * fVar240 + fVar225 * fVar209) - fVar119;
      fStack_1430 = (fStack_1430 * fVar240 + fVar222 * fVar209) - fVar119;
      fStack_142c = (fStack_142c * fVar240 + fVar229 * fVar209) - fVar119;
      fVar189 = fVar189 - fVar119;
      fVar193 = fVar193 - fVar119;
      fVar195 = fVar195 - fVar119;
      fVar197 = fVar197 - fVar119;
      fVar198 = fVar198 - fVar119;
      fVar200 = fVar200 - fVar119;
      fVar202 = fVar202 - fVar119;
      fVar204 = fVar204 - fVar119;
      fVar138 = fVar198 - fVar241;
      fVar147 = fVar200 - fVar194;
      fVar150 = fVar202 - fStack_1430;
      fVar153 = fVar204 - fStack_142c;
      local_1358 = fVar81 - fVar243;
      fStack_1354 = fVar112 - fVar215;
      fStack_1350 = fVar114 - fVar217;
      fStack_134c = fVar226 - fVar219;
      fVar229 = local_1298 - fVar181;
      fVar234 = fStack_1294 - fVar180;
      fStack_1340 = fStack_1290 - fStack_12b0;
      fStack_133c = fStack_128c - fStack_12ac;
      fVar119 = local_1368 - fVar81;
      fVar208 = fStack_1364 - fVar112;
      fStack_1420 = fStack_1360 - fVar114;
      fStack_141c = fStack_135c - fVar226;
      fVar209 = local_13c8 - local_1298;
      fVar113 = fStack_13c4 - fStack_1294;
      fVar115 = fStack_13c0 - fStack_1290;
      fVar117 = fStack_13bc - fStack_128c;
      _local_1348 = CONCAT44(fVar234,fVar229);
      fVar239 = fVar241 - fVar189;
      fVar149 = fVar194 - fVar193;
      fStack_12d0 = fStack_1430 - fVar195;
      fStack_12cc = fStack_142c - fVar197;
      fVar190 = fVar243 - local_1368;
      fVar196 = fVar215 - fStack_1364;
      fVar136 = fVar217 - fStack_1360;
      fVar137 = fVar219 - fStack_135c;
      local_12c8._0_4_ = fVar181 - local_13c8;
      local_12c8._4_4_ = fVar180 - fStack_13c4;
      local_12c8._8_4_ = fStack_12b0 - fStack_13c0;
      fStack_12bc = fStack_12ac - fStack_13bc;
      fVar222 = (local_1358 * (local_1298 + fVar181) - (fVar81 + fVar243) * fVar229) * fStack_13a4 +
                ((fVar198 + fVar241) * fVar229 - (local_1298 + fVar181) * fVar138) * fVar220 +
                (fVar138 * (fVar81 + fVar243) - (fVar198 + fVar241) * local_1358) * fStack_1394;
      fVar225 = (fStack_1354 * (fStack_1294 + fVar180) - (fVar112 + fVar215) * fVar234) *
                fStack_13a4 +
                ((fVar200 + fVar194) * fVar234 - (fStack_1294 + fVar180) * fVar147) * fVar220 +
                (fVar147 * (fVar112 + fVar215) - (fVar200 + fVar194) * fStack_1354) * fStack_1394;
      tNear.field_0._0_8_ = CONCAT44(fVar225,fVar222);
      tNear.field_0.v[2] =
           (fStack_1350 * (fStack_1290 + fStack_12b0) - (fVar114 + fVar217) * fStack_1340) *
           fStack_13a4 +
           ((fVar202 + fStack_1430) * fStack_1340 - (fStack_1290 + fStack_12b0) * fVar150) * fVar220
           + (fVar150 * (fVar114 + fVar217) - (fVar202 + fStack_1430) * fStack_1350) * fStack_1394;
      tNear.field_0.v[3] =
           (fStack_134c * (fStack_128c + fStack_12ac) - (fVar226 + fVar219) * fStack_133c) *
           fStack_13a4 +
           ((fVar204 + fStack_142c) * fStack_133c - (fStack_128c + fStack_12ac) * fVar153) * fVar220
           + (fVar153 * (fVar226 + fVar219) - (fVar204 + fStack_142c) * fStack_134c) * fStack_1394;
      fVar81 = fVar189 - fVar198;
      fVar112 = fVar193 - fVar200;
      fVar114 = fVar195 - fVar202;
      fVar146 = fVar197 - fVar204;
      fVar148 = (fVar190 * (local_13c8 + fVar181) - (local_1368 + fVar243) * local_12c8._0_4_) *
                fStack_13a4 +
                ((fVar241 + fVar189) * local_12c8._0_4_ - (local_13c8 + fVar181) * fVar239) *
                fVar220 + (fVar239 * (local_1368 + fVar243) - (fVar241 + fVar189) * fVar190) *
                          fStack_1394;
      fVar151 = (fVar196 * (fStack_13c4 + fVar180) - (fStack_1364 + fVar215) * local_12c8._4_4_) *
                fStack_13a4 +
                ((fVar194 + fVar193) * local_12c8._4_4_ - (fStack_13c4 + fVar180) * fVar149) *
                fVar220 + (fVar149 * (fStack_1364 + fVar215) - (fVar194 + fVar193) * fVar196) *
                          fStack_1394;
      fVar152 = (fVar136 * (fStack_13c0 + fStack_12b0) -
                (fStack_1360 + fVar217) * (float)local_12c8._8_4_) * fStack_13a4 +
                ((fStack_1430 + fVar195) * (float)local_12c8._8_4_ -
                (fStack_13c0 + fStack_12b0) * fStack_12d0) * fVar220 +
                (fStack_12d0 * (fStack_1360 + fVar217) - (fStack_1430 + fVar195) * fVar136) *
                fStack_1394;
      fVar199 = (fVar137 * (fStack_13bc + fStack_12ac) - (fStack_135c + fVar219) * fStack_12bc) *
                fStack_13a4 +
                ((fStack_142c + fVar197) * fStack_12bc - (fStack_13bc + fStack_12ac) * fStack_12cc)
                * fVar220 +
                (fStack_12cc * (fStack_135c + fVar219) - (fStack_142c + fVar197) * fVar137) *
                fStack_1394;
      auVar102._0_4_ =
           (fVar119 * local_1278 - local_1288 * fVar209) * fStack_13a4 +
           ((fVar198 + fVar189) * fVar209 - local_1278 * fVar81) * fVar220 +
           (fVar81 * local_1288 - (fVar198 + fVar189) * fVar119) * fStack_1394;
      auVar102._4_4_ =
           (fVar208 * fStack_1274 - fStack_1284 * fVar113) * fStack_13a4 +
           ((fVar200 + fVar193) * fVar113 - fStack_1274 * fVar112) * fVar220 +
           (fVar112 * fStack_1284 - (fVar200 + fVar193) * fVar208) * fStack_1394;
      auVar102._8_4_ =
           (fStack_1420 * fStack_1270 - fStack_1280 * fVar115) * fStack_13a4 +
           ((fVar202 + fVar195) * fVar115 - fStack_1270 * fVar114) * fVar220 +
           (fVar114 * fStack_1280 - (fVar202 + fVar195) * fStack_1420) * fStack_1394;
      auVar102._12_4_ =
           (fStack_141c * fStack_126c - fStack_127c * fVar117) * fStack_13a4 +
           ((fVar204 + fVar197) * fVar117 - fStack_126c * fVar146) * fVar220 +
           (fVar146 * fStack_127c - (fVar204 + fVar197) * fStack_141c) * fStack_1394;
      local_1368 = fVar222 + fVar148 + auVar102._0_4_;
      fStack_1364 = fVar225 + fVar151 + auVar102._4_4_;
      fStack_1360 = tNear.field_0.v[2] + fVar152 + auVar102._8_4_;
      fStack_135c = tNear.field_0.v[3] + fVar199 + auVar102._12_4_;
      auVar128._8_4_ = tNear.field_0.i[2];
      auVar128._0_8_ = tNear.field_0._0_8_;
      auVar128._12_4_ = tNear.field_0.i[3];
      auVar48._4_4_ = fVar151;
      auVar48._0_4_ = fVar148;
      auVar48._8_4_ = fVar152;
      auVar48._12_4_ = fVar199;
      auVar142 = minps(auVar128,auVar48);
      auVar142 = minps(auVar142,auVar102);
      auVar168._8_4_ = tNear.field_0.i[2];
      auVar168._0_8_ = tNear.field_0._0_8_;
      auVar168._12_4_ = tNear.field_0.i[3];
      auVar49._4_4_ = fVar151;
      auVar49._0_4_ = fVar148;
      auVar49._8_4_ = fVar152;
      auVar49._12_4_ = fVar199;
      auVar185 = maxps(auVar168,auVar49);
      auVar185 = maxps(auVar185,auVar102);
      fVar221 = ABS(local_1368) * 1.1920929e-07;
      fVar226 = ABS(fStack_1364) * 1.1920929e-07;
      fVar116 = ABS(fStack_1360) * 1.1920929e-07;
      fVar118 = ABS(fStack_135c) * 1.1920929e-07;
      auVar169._4_4_ = -(uint)(auVar185._4_4_ <= fVar226);
      auVar169._0_4_ = -(uint)(auVar185._0_4_ <= fVar221);
      auVar169._8_4_ = -(uint)(auVar185._8_4_ <= fVar116);
      auVar169._12_4_ = -(uint)(auVar185._12_4_ <= fVar118);
      auVar129._4_4_ = -(uint)(-fVar226 <= auVar142._4_4_);
      auVar129._0_4_ = -(uint)(-fVar221 <= auVar142._0_4_);
      auVar129._8_4_ = -(uint)(-fVar116 <= auVar142._8_4_);
      auVar129._12_4_ = -(uint)(-fVar118 <= auVar142._12_4_);
      auVar169 = auVar169 | auVar129;
      iVar54 = movmskps(uVar60,auVar169);
      if (iVar54 != 0) {
        auVar192._0_4_ = fVar190 * fVar209 - fVar119 * local_12c8._0_4_;
        auVar192._4_4_ = fVar196 * fVar113 - fVar208 * local_12c8._4_4_;
        auVar192._8_4_ = fVar136 * fVar115 - fStack_1420 * (float)local_12c8._8_4_;
        auVar192._12_4_ = fVar137 * fVar117 - fStack_141c * fStack_12bc;
        auVar103._4_4_ = -(uint)(ABS(fVar196 * fVar234) < ABS(fVar208 * local_12c8._4_4_));
        auVar103._0_4_ = -(uint)(ABS(fVar190 * fVar229) < ABS(fVar119 * local_12c8._0_4_));
        auVar103._8_4_ =
             -(uint)(ABS(fVar136 * fStack_1340) < ABS(fStack_1420 * (float)local_12c8._8_4_));
        auVar103._12_4_ = -(uint)(ABS(fVar137 * fStack_133c) < ABS(fStack_141c * fStack_12bc));
        auVar46._4_4_ = fStack_1354 * local_12c8._4_4_ - fVar196 * fVar234;
        auVar46._0_4_ = local_1358 * local_12c8._0_4_ - fVar190 * fVar229;
        auVar46._8_4_ = fStack_1350 * (float)local_12c8._8_4_ - fVar136 * fStack_1340;
        auVar46._12_4_ = fStack_134c * fStack_12bc - fVar137 * fStack_133c;
        local_11c8 = blendvps(auVar192,auVar46,auVar103);
        auVar188._0_4_ = fVar229 * fVar239 - fVar138 * local_12c8._0_4_;
        auVar188._4_4_ = fVar234 * fVar149 - fVar147 * local_12c8._4_4_;
        auVar188._8_4_ = fStack_1340 * fStack_12d0 - fVar150 * (float)local_12c8._8_4_;
        auVar188._12_4_ = fStack_133c * fStack_12cc - fVar153 * fStack_12bc;
        auVar242._0_4_ = fVar81 * local_12c8._0_4_ - fVar239 * fVar209;
        auVar242._4_4_ = fVar112 * local_12c8._4_4_ - fVar149 * fVar113;
        auVar242._8_4_ = fVar114 * (float)local_12c8._8_4_ - fStack_12d0 * fVar115;
        auVar242._12_4_ = fVar146 * fStack_12bc - fStack_12cc * fVar117;
        auVar104._4_4_ = -(uint)(ABS(fVar147 * local_12c8._4_4_) < ABS(fVar149 * fVar113));
        auVar104._0_4_ = -(uint)(ABS(fVar138 * local_12c8._0_4_) < ABS(fVar239 * fVar209));
        auVar104._8_4_ =
             -(uint)(ABS(fVar150 * (float)local_12c8._8_4_) < ABS(fStack_12d0 * fVar115));
        auVar104._12_4_ = -(uint)(ABS(fVar153 * fStack_12bc) < ABS(fStack_12cc * fVar117));
        local_11b8 = blendvps(auVar242,auVar188,auVar104);
        auVar231._0_4_ = fVar138 * fVar190 - fVar239 * local_1358;
        auVar231._4_4_ = fVar147 * fVar196 - fVar149 * fStack_1354;
        auVar231._8_4_ = fVar150 * fVar136 - fStack_12d0 * fStack_1350;
        auVar231._12_4_ = fVar153 * fVar137 - fStack_12cc * fStack_134c;
        auVar179._0_4_ = fVar239 * fVar119 - fVar81 * fVar190;
        auVar179._4_4_ = fVar149 * fVar208 - fVar112 * fVar196;
        auVar179._8_4_ = fStack_12d0 * fStack_1420 - fVar114 * fVar136;
        auVar179._12_4_ = fStack_12cc * fStack_141c - fVar146 * fVar137;
        auVar105._4_4_ = -(uint)(ABS(fVar149 * fStack_1354) < ABS(fVar112 * fVar196));
        auVar105._0_4_ = -(uint)(ABS(fVar239 * local_1358) < ABS(fVar81 * fVar190));
        auVar105._8_4_ = -(uint)(ABS(fStack_12d0 * fStack_1350) < ABS(fVar114 * fVar136));
        auVar105._12_4_ = -(uint)(ABS(fStack_12cc * fStack_134c) < ABS(fVar146 * fVar137));
        local_11a8 = blendvps(auVar179,auVar231,auVar105);
        fVar116 = fStack_13a4 * local_11c8._0_4_ +
                  fVar220 * local_11b8._0_4_ + fStack_1394 * local_11a8._0_4_;
        fVar117 = fStack_13a4 * local_11c8._4_4_ +
                  fVar220 * local_11b8._4_4_ + fStack_1394 * local_11a8._4_4_;
        fVar118 = fStack_13a4 * local_11c8._8_4_ +
                  fVar220 * local_11b8._8_4_ + fStack_1394 * local_11a8._8_4_;
        fVar138 = fStack_13a4 * local_11c8._12_4_ +
                  fVar220 * local_11b8._12_4_ + fStack_1394 * local_11a8._12_4_;
        fVar116 = fVar116 + fVar116;
        fVar117 = fVar117 + fVar117;
        fVar118 = fVar118 + fVar118;
        fVar138 = fVar138 + fVar138;
        auVar106._0_4_ = fVar181 * local_11a8._0_4_;
        auVar106._4_4_ = fVar180 * local_11a8._4_4_;
        auVar106._8_4_ = fStack_12b0 * local_11a8._8_4_;
        auVar106._12_4_ = fStack_12ac * local_11a8._12_4_;
        fVar220 = fVar241 * local_11c8._0_4_ + fVar243 * local_11b8._0_4_ + auVar106._0_4_;
        fVar226 = fVar194 * local_11c8._4_4_ + fVar215 * local_11b8._4_4_ + auVar106._4_4_;
        fVar113 = fStack_1430 * local_11c8._8_4_ + fVar217 * local_11b8._8_4_ + auVar106._8_4_;
        fVar115 = fStack_142c * local_11c8._12_4_ + fVar219 * local_11b8._12_4_ + auVar106._12_4_;
        auVar42._4_4_ = fVar117;
        auVar42._0_4_ = fVar116;
        auVar42._8_4_ = fVar118;
        auVar42._12_4_ = fVar138;
        auVar142 = rcpps(auVar106,auVar42);
        fVar119 = auVar142._0_4_;
        fVar209 = auVar142._4_4_;
        fVar221 = auVar142._8_4_;
        fVar208 = auVar142._12_4_;
        fVar220 = ((1.0 - fVar116 * fVar119) * fVar119 + fVar119) * (fVar220 + fVar220);
        fVar226 = ((1.0 - fVar117 * fVar209) * fVar209 + fVar209) * (fVar226 + fVar226);
        fVar221 = ((1.0 - fVar118 * fVar221) * fVar221 + fVar221) * (fVar113 + fVar113);
        fVar208 = ((1.0 - fVar138 * fVar208) * fVar208 + fVar208) * (fVar115 + fVar115);
        fVar209 = *(float *)(ray + k * 4 + 0x80);
        fVar119 = *(float *)(ray + k * 4 + 0x30);
        auVar130._0_4_ = -(uint)(fVar220 <= fVar209 && fVar119 <= fVar220) & auVar169._0_4_;
        auVar130._4_4_ = -(uint)(fVar226 <= fVar209 && fVar119 <= fVar226) & auVar169._4_4_;
        auVar130._8_4_ = -(uint)(fVar221 <= fVar209 && fVar119 <= fVar221) & auVar169._8_4_;
        auVar130._12_4_ = -(uint)(fVar208 <= fVar209 && fVar119 <= fVar208) & auVar169._12_4_;
        iVar54 = movmskps(iVar54,auVar130);
        if (iVar54 != 0) {
          uVar60 = auVar130._0_4_ & -(uint)(fVar116 != 0.0);
          uVar120 = auVar130._4_4_ & -(uint)(fVar117 != 0.0);
          valid.field_0._0_8_ = CONCAT44(uVar120,uVar60);
          valid.field_0.i[2] = auVar130._8_4_ & -(uint)(fVar118 != 0.0);
          valid.field_0.i[3] = auVar130._12_4_ & -(uint)(fVar138 != 0.0);
          iVar54 = movmskps(iVar54,(undefined1  [16])valid.field_0);
          if (iVar54 != 0) {
            auVar51._4_4_ = fStack_1364;
            auVar51._0_4_ = local_1368;
            auVar51._8_4_ = fStack_1360;
            auVar51._12_4_ = fStack_135c;
            local_11d8._4_4_ = fVar226;
            local_11d8._0_4_ = fVar220;
            fStack_11d0 = fVar221;
            fStack_11cc = fVar208;
            local_1198._8_8_ = uStack_10a0;
            local_1198._0_8_ = local_10a8;
            pSVar24 = context->scene;
            local_1428 = SUB84(pSVar24,0);
            uStack_1424 = (undefined4)((ulong)pSVar24 >> 0x20);
            auVar142 = rcpps(auVar169,auVar51);
            fVar113 = auVar142._0_4_;
            fVar115 = auVar142._4_4_;
            fVar116 = auVar142._8_4_;
            fVar117 = auVar142._12_4_;
            fVar118 = (float)DAT_01f46a60;
            fVar138 = DAT_01f46a60._4_4_;
            fVar147 = DAT_01f46a60._12_4_;
            fVar119 = DAT_01f46a60._8_4_;
            fVar113 = (float)(-(uint)(1e-18 <= ABS(local_1368)) &
                             (uint)((fVar118 - local_1368 * fVar113) * fVar113 + fVar113));
            fVar115 = (float)(-(uint)(1e-18 <= ABS(fStack_1364)) &
                             (uint)((fVar138 - fStack_1364 * fVar115) * fVar115 + fVar115));
            fVar116 = (float)(-(uint)(1e-18 <= ABS(fStack_1360)) &
                             (uint)((fVar119 - fStack_1360 * fVar116) * fVar116 + fVar116));
            fVar117 = (float)(-(uint)(1e-18 <= ABS(fStack_135c)) &
                             (uint)((fVar147 - fStack_135c * fVar117) * fVar117 + fVar117));
            auVar224._0_4_ = fVar222 * fVar113;
            auVar224._4_4_ = fVar225 * fVar115;
            auVar224._8_4_ = tNear.field_0.v[2] * fVar116;
            auVar224._12_4_ = tNear.field_0.v[3] * fVar117;
            auVar185 = minps(auVar224,_DAT_01f46a60);
            auVar212._0_4_ = fVar113 * fVar148;
            auVar212._4_4_ = fVar115 * fVar151;
            auVar212._8_4_ = fVar116 * fVar152;
            auVar212._12_4_ = fVar117 * fVar199;
            auVar142 = minps(auVar212,_DAT_01f46a60);
            auVar145._0_4_ = fVar118 - auVar185._0_4_;
            auVar145._4_4_ = fVar138 - auVar185._4_4_;
            auVar145._8_4_ = fVar119 - auVar185._8_4_;
            auVar145._12_4_ = fVar147 - auVar185._12_4_;
            auVar170._0_4_ = fVar118 - auVar142._0_4_;
            auVar170._4_4_ = fVar138 - auVar142._4_4_;
            auVar170._8_4_ = fVar119 - auVar142._8_4_;
            auVar170._12_4_ = fVar147 - auVar142._12_4_;
            local_11f8 = blendvps(auVar185,auVar145,local_1198);
            local_11e8 = blendvps(auVar142,auVar170,local_1198);
            auVar107._8_4_ = valid.field_0.i[2];
            auVar107._0_8_ = valid.field_0._0_8_;
            auVar107._12_4_ = valid.field_0.i[3];
            auVar44._4_4_ = fVar226;
            auVar44._0_4_ = fVar220;
            auVar44._8_4_ = fVar221;
            auVar44._12_4_ = fVar208;
            auVar185 = blendvps(_DAT_01f45a30,auVar44,auVar107);
            auVar160._4_4_ = auVar185._0_4_;
            auVar160._0_4_ = auVar185._4_4_;
            auVar160._8_4_ = auVar185._12_4_;
            auVar160._12_4_ = auVar185._8_4_;
            auVar142 = minps(auVar160,auVar185);
            auVar108._0_8_ = auVar142._8_8_;
            auVar108._8_4_ = auVar142._0_4_;
            auVar108._12_4_ = auVar142._4_4_;
            auVar142 = minps(auVar108,auVar142);
            auVar109._0_8_ =
                 CONCAT44(-(uint)(auVar142._4_4_ == auVar185._4_4_) & uVar120,
                          -(uint)(auVar142._0_4_ == auVar185._0_4_) & uVar60);
            auVar109._8_4_ = -(uint)(auVar142._8_4_ == auVar185._8_4_) & valid.field_0.i[2];
            auVar109._12_4_ = -(uint)(auVar142._12_4_ == auVar185._12_4_) & valid.field_0.i[3];
            iVar54 = movmskps(local_1428,auVar109);
            aVar131 = valid.field_0;
            if (iVar54 != 0) {
              aVar131.i[2] = auVar109._8_4_;
              aVar131._0_8_ = auVar109._0_8_;
              aVar131.i[3] = auVar109._12_4_;
            }
            uVar55 = movmskps(iVar54,(undefined1  [16])aVar131);
            lVar58 = 0;
            if (CONCAT44(uStack_1424,uVar55) != 0) {
              for (; (CONCAT44(uStack_1424,uVar55) >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
              }
            }
LAB_0071ef42:
            uVar60 = *(uint *)(lVar74 + 0x40 + lVar58 * 4);
            pDVar59 = (Device *)(ulong)uVar60;
            pGVar33 = (pSVar24->geometries).items[(long)pDVar59].ptr;
            pGVar61 = (Geometry *)(ulong)*(uint *)(ray + k * 4 + 0x90);
            if ((pGVar33->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              valid.field_0.v[lVar58] = 0.0;
            }
            else {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar33->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                uVar55 = *(undefined4 *)(local_11f8 + lVar58 * 4);
                uVar21 = *(undefined4 *)(local_11e8 + lVar58 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar58 * 4);
                *(undefined4 *)(ray + k * 4 + 0xc0) = *(undefined4 *)(local_11c8 + lVar58 * 4);
                *(undefined4 *)(ray + k * 4 + 0xd0) = *(undefined4 *)(local_11b8 + lVar58 * 4);
                *(undefined4 *)(ray + k * 4 + 0xe0) = *(undefined4 *)(local_11a8 + lVar58 * 4);
                *(undefined4 *)(ray + k * 4 + 0xf0) = uVar55;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar21;
                uVar120 = *(uint *)(lVar74 + 0x50 + lVar58 * 4);
                pGVar61 = (Geometry *)(ulong)uVar120;
                *(uint *)(ray + k * 4 + 0x110) = uVar120;
                *(uint *)(ray + k * 4 + 0x120) = uVar60;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                goto LAB_0071f3fe;
              }
              local_1108 = *(undefined4 *)(local_11f8 + lVar58 * 4);
              local_10f8 = *(undefined4 *)(local_11e8 + lVar58 * 4);
              uVar55 = *(undefined4 *)(local_11c8 + lVar58 * 4);
              uVar21 = *(undefined4 *)(local_11b8 + lVar58 * 4);
              local_10d8._4_4_ = uVar60;
              local_10d8._0_4_ = uVar60;
              local_10d8._8_4_ = uVar60;
              local_10d8._12_4_ = uVar60;
              uVar22 = *(undefined4 *)(lVar74 + 0x50 + lVar58 * 4);
              local_10e8._4_4_ = uVar22;
              local_10e8._0_4_ = uVar22;
              local_10e8._8_4_ = uVar22;
              local_10e8._12_4_ = uVar22;
              local_1138._4_4_ = uVar55;
              local_1138._0_4_ = uVar55;
              local_1138._8_4_ = uVar55;
              local_1138._12_4_ = uVar55;
              local_1128._4_4_ = uVar21;
              local_1128._0_4_ = uVar21;
              local_1128._8_4_ = uVar21;
              local_1128._12_4_ = uVar21;
              local_1118._4_4_ = *(undefined4 *)(local_11a8 + lVar58 * 4);
              local_1118._0_4_ = local_1118._4_4_;
              local_1118._8_4_ = local_1118._4_4_;
              local_1118._12_4_ = local_1118._4_4_;
              uStack_1104 = local_1108;
              uStack_1100 = local_1108;
              uStack_10fc = local_1108;
              uStack_10f4 = local_10f8;
              uStack_10f0 = local_10f8;
              uStack_10ec = local_10f8;
              local_10c8 = context->user->instID[0];
              uStack_10c4 = local_10c8;
              uStack_10c0 = local_10c8;
              uStack_10bc = local_10c8;
              local_10b8 = context->user->instPrimID[0];
              uStack_10b4 = local_10b8;
              uStack_10b0 = local_10b8;
              uStack_10ac = local_10b8;
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_11d8 + lVar58 * 4);
              local_1388 = *local_12a8;
              args.valid = (int *)local_1388;
              args.geometryUserPtr = pGVar33->userPtr;
              args.context = context->user;
              args.hit = (RTCHitN *)local_1138;
              args.N = 4;
              pDVar59 = (Device *)pGVar33->intersectionFilterN;
              fStack_1430 = 0.0;
              fStack_142c = 0.0;
              pGVar61 = pGVar33;
              args.ray = (RTCRayN *)ray;
              if (pDVar59 != (Device *)0x0) {
                pDVar59 = (Device *)(*(code *)pDVar59)(&args);
              }
              if (local_1388 == (undefined1  [16])0x0) {
                auVar132._8_4_ = 0xffffffff;
                auVar132._0_8_ = 0xffffffffffffffff;
                auVar132._12_4_ = 0xffffffff;
                auVar132 = auVar132 ^ _DAT_01f46b70;
              }
              else {
                pGVar61 = (Geometry *)context->args;
                pDVar59 = pGVar61->device;
                if ((pDVar59 != (Device *)0x0) &&
                   ((((ulong)(pGVar61->super_RefCount)._vptr_RefCount & 2) != 0 ||
                    (pGVar61 = pGVar33, ((pGVar33->field_8).field_0x2 & 0x40) != 0)))) {
                  pDVar59 = (Device *)(*(code *)pDVar59)(&args);
                }
                auVar110._0_4_ = -(uint)(local_1388._0_4_ == 0);
                auVar110._4_4_ = -(uint)(local_1388._4_4_ == 0);
                auVar110._8_4_ = -(uint)(local_1388._8_4_ == 0);
                auVar110._12_4_ = -(uint)(local_1388._12_4_ == 0);
                auVar132 = auVar110 ^ _DAT_01f46b70;
                if (local_1388 != (undefined1  [16])0x0) {
                  auVar142 = blendvps(*(undefined1 (*) [16])args.hit,
                                      *(undefined1 (*) [16])(args.ray + 0xc0),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0xc0) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x10),
                                      *(undefined1 (*) [16])(args.ray + 0xd0),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0xd0) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x20),
                                      *(undefined1 (*) [16])(args.ray + 0xe0),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0xe0) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x30),
                                      *(undefined1 (*) [16])(args.ray + 0xf0),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0xf0) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x40),
                                      *(undefined1 (*) [16])(args.ray + 0x100),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0x100) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x50),
                                      *(undefined1 (*) [16])(args.ray + 0x110),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0x110) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x60),
                                      *(undefined1 (*) [16])(args.ray + 0x120),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0x120) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x70),
                                      *(undefined1 (*) [16])(args.ray + 0x130),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0x130) = auVar142;
                  auVar142 = blendvps(*(undefined1 (*) [16])(args.hit + 0x80),
                                      *(undefined1 (*) [16])(args.ray + 0x140),auVar110);
                  *(undefined1 (*) [16])(args.ray + 0x140) = auVar142;
                  pDVar59 = (Device *)args.ray;
                  pGVar61 = (Geometry *)args.hit;
                }
              }
              if ((_DAT_01f46b40 & auVar132) == (undefined1  [16])0x0) {
                *(float *)(ray + k * 4 + 0x80) = fVar209;
              }
              else {
                fVar209 = *(float *)(ray + k * 4 + 0x80);
              }
              valid.field_0.v[lVar58] = 0.0;
              valid.field_0.i[0] = -(uint)(fVar220 <= fVar209) & valid.field_0.i[0];
              valid.field_0.i[1] = -(uint)(fVar226 <= fVar209) & valid.field_0.i[1];
              valid.field_0.i[2] = -(uint)(fVar221 <= fVar209) & valid.field_0.i[2];
              valid.field_0.i[3] = -(uint)(fVar208 <= fVar209) & valid.field_0.i[3];
            }
            iVar54 = movmskps((int)pDVar59,(undefined1  [16])valid.field_0);
            if (iVar54 == 0) goto LAB_0071f3fe;
            auVar45._4_4_ = fVar226;
            auVar45._0_4_ = fVar220;
            auVar45._8_4_ = fVar221;
            auVar45._12_4_ = fVar208;
            auVar185 = blendvps(_DAT_01f45a30,auVar45,(undefined1  [16])valid.field_0);
            auVar161._4_4_ = auVar185._0_4_;
            auVar161._0_4_ = auVar185._4_4_;
            auVar161._8_4_ = auVar185._12_4_;
            auVar161._12_4_ = auVar185._8_4_;
            auVar142 = minps(auVar161,auVar185);
            auVar133._0_8_ = auVar142._8_8_;
            auVar133._8_4_ = auVar142._0_4_;
            auVar133._12_4_ = auVar142._4_4_;
            auVar142 = minps(auVar133,auVar142);
            auVar134._0_8_ =
                 CONCAT44(-(uint)(auVar142._4_4_ == auVar185._4_4_) & valid.field_0._4_4_,
                          -(uint)(auVar142._0_4_ == auVar185._0_4_) & valid.field_0._0_4_);
            auVar134._8_4_ = -(uint)(auVar142._8_4_ == auVar185._8_4_) & valid.field_0._8_4_;
            auVar134._12_4_ = -(uint)(auVar142._12_4_ == auVar185._12_4_) & valid.field_0._12_4_;
            iVar54 = movmskps(iVar54,auVar134);
            aVar111 = valid.field_0;
            if (iVar54 != 0) {
              aVar111.i[2] = auVar134._8_4_;
              aVar111._0_8_ = auVar134._0_8_;
              aVar111.i[3] = auVar134._12_4_;
            }
            uVar55 = movmskps(iVar54,(undefined1  [16])aVar111);
            uVar56 = CONCAT44((int)((ulong)pDVar59 >> 0x20),uVar55);
            lVar58 = 0;
            if (uVar56 != 0) {
              for (; (uVar56 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
              }
            }
            goto LAB_0071ef42;
          }
        }
      }
LAB_0071f3fe:
      auVar142 = local_1158;
      fVar119 = local_1018;
      fVar113 = fStack_1014;
      fVar115 = fStack_1010;
      fVar116 = fStack_100c;
      fVar209 = local_1028;
      fVar117 = fStack_1024;
      fVar118 = fStack_1020;
      fVar138 = fStack_101c;
      fVar221 = local_1038;
      fVar147 = fStack_1034;
      fVar150 = fStack_1030;
      fVar153 = fStack_102c;
      fVar243 = local_1088;
      fVar181 = fStack_1084;
      fVar222 = fStack_1080;
      fVar217 = fStack_107c;
      fVar180 = local_1148;
      fVar215 = fStack_1144;
      fVar225 = fStack_1140;
      fVar219 = fStack_113c;
      fVar208 = local_1048;
      fVar229 = fStack_1044;
      fVar234 = fStack_1040;
      fVar241 = fStack_103c;
      fVar220 = local_1058;
      fVar81 = fStack_1054;
      fVar112 = fStack_1050;
      fVar114 = fStack_104c;
      fVar226 = local_1068;
      fVar190 = fStack_1064;
      fVar194 = fStack_1060;
      fVar196 = fStack_105c;
      fVar239 = local_1078;
      fVar136 = fStack_1074;
      fVar137 = fStack_1070;
      fVar146 = fStack_106c;
    }
    uVar55 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar185._4_4_ = uVar55;
    auVar185._0_4_ = uVar55;
    auVar185._8_4_ = uVar55;
    auVar185._12_4_ = uVar55;
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }